

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O0

Symbol * __thiscall slang::ast::ASTContext::tryFillAssertionDetails(ASTContext *this)

{
  Scope *pSVar1;
  CheckerInstanceBodySymbol *pCVar2;
  long in_RDI;
  Scope *nextScope;
  CheckerInstanceBodySymbol *body;
  Symbol *parentSym;
  Symbol *local_18;
  Symbol *local_8;
  
  if (*(long *)(in_RDI + 0x30) == 0) {
    pSVar1 = not_null<const_slang::ast::Scope_*>::operator->
                       ((not_null<const_slang::ast::Scope_*> *)0x4ed162);
    local_18 = Scope::asSymbol(pSVar1);
    while (local_18->kind != InstanceBody) {
      if (local_18->kind == CheckerInstanceBody) {
        pCVar2 = Symbol::as<slang::ast::CheckerInstanceBodySymbol>((Symbol *)0x4ed199);
        *(AssertionInstanceDetails **)(in_RDI + 0x30) = pCVar2->assertionDetails;
        return local_18;
      }
      pSVar1 = Symbol::getParentScope(local_18);
      if (pSVar1 == (Scope *)0x0) {
        return (Symbol *)0x0;
      }
      local_18 = Scope::asSymbol(pSVar1);
    }
    local_8 = local_18;
  }
  else {
    local_8 = (Symbol *)0x0;
  }
  return local_8;
}

Assistant:

const Symbol* ASTContext::tryFillAssertionDetails() {
    if (assertionInstance)
        return nullptr;

    auto parentSym = &scope->asSymbol();
    while (true) {
        if (parentSym->kind == SymbolKind::InstanceBody)
            return parentSym;

        if (parentSym->kind == SymbolKind::CheckerInstanceBody) {
            auto& body = parentSym->as<CheckerInstanceBodySymbol>();
            assertionInstance = &body.assertionDetails;
            return parentSym;
        }

        auto nextScope = parentSym->getParentScope();
        if (!nextScope)
            break;

        parentSym = &nextScope->asSymbol();
    }

    return nullptr;
}